

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

void m_initgrp(monst *mtmp,level *lev,int x,int y,int n)

{
  xchar xVar1;
  boolean bVar2;
  monst *mtmp_00;
  int iVar3;
  int local_3c;
  monst *mon;
  int cnt;
  int dl;
  int iStack_20;
  coord mm;
  int n_local;
  int y_local;
  int x_local;
  level *lev_local;
  monst *mtmp_local;
  
  dl = n;
  iStack_20 = y;
  xVar1 = level_difficulty(&lev->z);
  mon._0_4_ = rnd(dl);
  if ('\0' < xVar1) {
    if (xVar1 < '\x03') {
      local_3c = 4;
    }
    else {
      local_3c = 1;
      if (xVar1 < '\x05') {
        local_3c = 2;
      }
    }
    mon._0_4_ = (int)mon / local_3c;
    if ((int)mon == 0) {
      mon._0_4_ = 1;
    }
  }
  cnt._2_1_ = (xchar)x;
  cnt._3_1_ = (xchar)iStack_20;
  while (iVar3 = (int)mon + -1, (int)mon != 0) {
    bVar2 = peace_minded(mtmp->data);
    mon._0_4_ = iVar3;
    if (((bVar2 == '\0') &&
        (bVar2 = enexto((coord *)((long)&cnt + 2),lev,cnt._2_1_,cnt._3_1_,mtmp->data), bVar2 != '\0'
        )) && (mtmp_00 = makemon(mtmp->data,lev,(int)cnt._2_1_,(int)cnt._3_1_,0),
              mtmp_00 != (monst *)0x0)) {
      *(uint *)&mtmp_00->field_0x60 = *(uint *)&mtmp_00->field_0x60 & 0xffbfffff;
      *(uint *)&mtmp_00->field_0x60 = *(uint *)&mtmp_00->field_0x60 & 0xffff7fff;
      set_malign(mtmp_00);
    }
  }
  return;
}

Assistant:

static void m_initgrp(struct monst *mtmp, struct level *lev, int x, int y, int n)
{
	coord mm;
	int dl = level_difficulty(&lev->z);
	int cnt = rnd(n);
	struct monst *mon;

	/* Tuning: cut down on swarming at shallow depths */
	if (dl > 0) {
	    cnt /= (dl < 3) ? 4 : (dl < 5) ? 2 : 1;
	    if (!cnt) cnt++;
	}

	mm.x = x;
	mm.y = y;
	while (cnt--) {
		if (peace_minded(mtmp->data)) continue;
		/* Don't create groups of peaceful monsters since they'll get
		 * in our way.  If the monster has a percentage chance so some
		 * are peaceful and some are not, the result will just be a
		 * smaller group.
		 */
		if (enexto(&mm, lev, mm.x, mm.y, mtmp->data)) {
		    mon = makemon(mtmp->data, lev, mm.x, mm.y, NO_MM_FLAGS);
		    if (mon) {
			mon->mpeaceful = FALSE;
			mon->mavenge = 0;
			set_malign(mon);
			/* Undo the second peace_minded() check in makemon();
			 * if the monster turned out to be peaceful the first
			 * time we didn't create it at all; we don't want a
			 * second check.
			 */
		    }
		}
	}
}